

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O2

int __thiscall
icu_63::LocaleCacheKey<icu_63::DateFmtBestPattern>::clone
          (LocaleCacheKey<icu_63::DateFmtBestPattern> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  LocaleCacheKey<icu_63::DateFmtBestPattern> *this_00;
  
  this_00 = (LocaleCacheKey<icu_63::DateFmtBestPattern> *)
            UMemory::operator_new((UMemory *)0xf0,(size_t)__fn);
  if (this_00 != (LocaleCacheKey<icu_63::DateFmtBestPattern> *)0x0) {
    LocaleCacheKey(this_00,this);
  }
  return (int)this_00;
}

Assistant:

virtual CacheKeyBase *clone() const {
       return new LocaleCacheKey<T>(*this);
   }